

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Result __thiscall
testing::internal::
FunctionMocker<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error)>
::PerformDefaultAction
          (FunctionMocker<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error)>
           *this,ArgumentTuple *args,string *call_description)

{
  OnCallSpec<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error)>
  *this_00;
  Action<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error)>
  *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  string message;
  _Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
  _Stack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 ==
      (OnCallSpec<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error)>
       *)0x0) {
    __return_storage_ptr__ = &local_38;
    std::operator+(__return_storage_ptr__,call_description,
                   "\n    The mock function has no default action set, and its return type has no default value set."
                  );
  }
  else {
    this_01 = OnCallSpec<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error)>
              ::GetAction(this_00);
    std::
    _Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
    ::_Tuple_impl(&_Stack_68,
                  &args->
                   super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
                 );
    Action<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error)>
    ::Perform(this_01,(ArgumentTuple *)&_Stack_68);
    __return_storage_ptr__ =
         &_Stack_68.super__Tuple_impl<1UL,_ot::commissioner::Error>.
          super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mMessage;
  }
  std::__cxx11::string::~string((string *)__return_storage_ptr__);
  return;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }